

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O2

bool __thiscall PcodeOp::isCseMatch(PcodeOp *this,PcodeOp *op)

{
  OpCode OVar1;
  pointer ppVVar2;
  pointer ppVVar3;
  Varnode *pVVar4;
  Varnode *pVVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  if ((((this->flags & 0x18000) != 0) && ((op->flags & 0x18000) != 0)) &&
     (this->output->size == op->output->size)) {
    OVar1 = this->opcode->opcode;
    if (OVar1 == CPUI_COPY) {
      return false;
    }
    if (OVar1 != op->opcode->opcode) {
      return false;
    }
    ppVVar2 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar6 = (long)(this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppVVar2;
    ppVVar3 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (lVar6 == (long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3) {
      lVar7 = 0;
      do {
        bVar8 = lVar6 >> 3 == lVar7;
        if (bVar8) {
          return bVar8;
        }
        pVVar4 = ppVVar2[lVar7];
        pVVar5 = ppVVar3[lVar7];
        if (pVVar4 != pVVar5) {
          if ((pVVar4->flags & 2) == 0) {
            return bVar8;
          }
          if ((pVVar5->flags & 2) == 0) {
            return bVar8;
          }
          if ((pVVar4->loc).offset != (pVVar5->loc).offset) {
            return bVar8;
          }
        }
        lVar7 = lVar7 + 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool PcodeOp::isCseMatch(const PcodeOp *op) const

{
  if ((getEvalType()&(PcodeOp::unary|PcodeOp::binary))==0) return false;
  if ((op->getEvalType()&(PcodeOp::unary|PcodeOp::binary))==0) return false;
  if (output->getSize() != op->output->getSize()) return false;
  if (code() != op->code()) return false;
  if (code() == CPUI_COPY) return false; // Let copy propagation deal with this
  if (inrefs.size() != op->inrefs.size()) return false;
  for(int4 i=0;i<inrefs.size();++i) {
    const Varnode *vn1 = getIn(i);
    const Varnode *vn2 = op->getIn(i);
    if (vn1 == vn2) continue;
    if (vn1->isConstant()&&vn2->isConstant()&&(vn1->getOffset()==vn2->getOffset()))
      continue;
    return false;
  }
  return true;
}